

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O2

void __thiscall FIX::Mutex::Mutex(Mutex *this)

{
  this->m_count = 0;
  this->m_threadID = 0;
  pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

Mutex() {
#ifdef _MSC_VER
    InitializeCriticalSection(&m_mutex);
#else
    m_count = 0;
    m_threadID = 0;
    // pthread_mutexattr_t attr;
    // pthread_mutexattr_init(&attr);
    // pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    // pthread_mutex_init(&m_mutex, &attr);
    pthread_mutex_init(&m_mutex, 0);
#endif
  }